

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall HighsCliqueTable::removeClique(HighsCliqueTable *this,HighsInt cliqueid)

{
  uint uVar1;
  CliqueVar CVar2;
  CliqueVar CVar3;
  pointer pCVar4;
  pointer pCVar5;
  KeyType KVar6;
  HighsInt i;
  uint uVar7;
  HighsInt len;
  HighsInt start;
  int local_34;
  uint local_30;
  HighsInt local_2c;
  KeyType local_28;
  
  pCVar5 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_2c = cliqueid;
  if ((pCVar5[cliqueid].origin | 0x80000000U) != 0xffffffff) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->deletedrows,&pCVar5[cliqueid].origin);
    pCVar5 = (this->cliques).
             super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar7 = pCVar5[cliqueid].start;
  uVar1 = pCVar5[cliqueid].end;
  local_34 = uVar1 - uVar7;
  local_30 = uVar7;
  if (local_34 == 2) {
    pCVar4 = (this->cliqueentries).
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ._M_impl.super__Vector_impl_data._M_start;
    CVar2 = pCVar4[(int)uVar7];
    CVar3 = pCVar4[(long)(int)uVar7 + 1];
    KVar6.second = CVar2;
    KVar6.first = CVar3;
    local_28 = (KeyType)((long)KVar6 << 0x20 | (ulong)(uint)CVar2);
    if (((uint)CVar3 & 0x7fffffff) < ((uint)CVar2 & 0x7fffffff)) {
      local_28 = KVar6;
    }
    HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::erase
              (&this->sizeTwoCliques,&local_28);
  }
  for (; uVar1 != uVar7; uVar7 = uVar7 + 1) {
    unlink(this,(char *)(ulong)uVar7);
  }
  std::vector<int,_std::allocator<int>_>::push_back(&this->freeslots,&local_2c);
  std::
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  ::_M_emplace_unique<int&,int&>
            ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
              *)&this->freespaces,&local_34,(int *)&local_30);
  pCVar5 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar5[local_2c].start = -1;
  pCVar5[local_2c].end = -1;
  this->numEntries = this->numEntries - local_34;
  return;
}

Assistant:

void HighsCliqueTable::removeClique(HighsInt cliqueid) {
  if (cliques[cliqueid].origin != kHighsIInf && cliques[cliqueid].origin != -1)
    deletedrows.push_back(cliques[cliqueid].origin);

  HighsInt start = cliques[cliqueid].start;
  assert(start != -1);
  HighsInt end = cliques[cliqueid].end;
  HighsInt len = end - start;
  if (len == 2) {
    sizeTwoCliques.erase(
        sortedEdge(cliqueentries[start], cliqueentries[start + 1]));
  }

  for (HighsInt i = start; i != end; ++i) {
    unlink(i, cliqueid);
  }

  freeslots.push_back(cliqueid);
  freespaces.emplace(len, start);

  cliques[cliqueid].start = -1;
  cliques[cliqueid].end = -1;
  numEntries -= len;
}